

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O3

void symmetry_transform(loc_conflict *grid,wchar_t y0,wchar_t x0,wchar_t height,wchar_t width,
                       wchar_t rotate,_Bool reflect)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = rotate % 4;
  uVar5 = grid->x;
  if (0 < iVar3) {
    uVar6 = grid->y;
    wVar1 = width;
    wVar2 = height;
    do {
      width = wVar2;
      wVar2 = wVar1;
      uVar4 = uVar5;
      uVar5 = ~uVar6 + width;
      iVar3 = iVar3 + -1;
      uVar6 = uVar4;
      wVar1 = width;
    } while (iVar3 != 0);
    grid->y = uVar4;
  }
  uVar6 = ~uVar5 + width;
  if (!reflect) {
    uVar6 = uVar5;
  }
  grid->y = grid->y + y0;
  grid->x = uVar6 + x0;
  return;
}

Assistant:

void symmetry_transform(struct loc *grid, int y0, int x0, int height, int width,
						int rotate, bool reflect)
{
	/* Track what the dimensions are after rotations. */
	int rheight = height, rwidth = width;
	int i;

	/* Rotate (in multiples of 90 degrees clockwise) */
	for (i = 0; i < rotate % 4; i++) {
		int temp = grid->x;
		grid->x = rheight - 1 - (grid->y);
		grid->y = temp;
		temp = rwidth;
		rwidth = rheight;
		rheight = temp;
	}

	/* Reflect (horizontally in the rotated system) */
	if (reflect)
		grid->x = rwidth - 1 - grid->x;

	/* Translate */
	grid->y += y0;
	grid->x += x0;
}